

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int co_cond_timedwait(stCoCond_t *link,int ms)

{
  int iVar1;
  stCoCondItem_t *ap;
  stCoRoutine_t *psVar2;
  unsigned_long_long allNow;
  long *plVar3;
  
  ap = (stCoCondItem_t *)calloc(1,0x58);
  psVar2 = GetCurrThreadCo();
  (ap->timeout).pArg = psVar2;
  (ap->timeout).pfnProcess = OnSignalProcessEvent;
  if (0 < ms) {
    allNow = GetTickMS();
    (ap->timeout).ullExpireTime = (uint)ms + allNow;
    plVar3 = (long *)__tls_get_addr(&PTR_0010afa8);
    iVar1 = AddTimeout(*(stTimeout_t **)(*(long *)(*plVar3 + 0x408) + 8),&ap->timeout,allNow);
    if (iVar1 != 0) goto LAB_0010706c;
  }
  AddTail<stCoCondItem_t,stCoCond_t>(link,ap);
  co_yield_ct();
  RemoveFromLink<stCoCondItem_t,stCoCond_t>(ap);
  iVar1 = 0;
LAB_0010706c:
  free(ap);
  return iVar1;
}

Assistant:

int co_cond_timedwait( stCoCond_t *link,int ms )
{
	stCoCondItem_t* psi = (stCoCondItem_t*)calloc(1, sizeof(stCoCondItem_t));
	psi->timeout.pArg = GetCurrThreadCo();
	psi->timeout.pfnProcess = OnSignalProcessEvent;

	if( ms > 0 )
	{
		unsigned long long now = GetTickMS();
		psi->timeout.ullExpireTime = now + ms;

		int ret = AddTimeout( co_get_curr_thread_env()->pEpoll->pTimeout,&psi->timeout,now );
		if( ret != 0 )
		{
			free(psi);
			return ret;
		}
	}
	AddTail( link, psi);

	co_yield_ct();


	RemoveFromLink<stCoCondItem_t,stCoCond_t>( psi );
	free(psi);

	return 0;
}